

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

void estimate_ref_frame_costs
               (AV1_COMMON *cm,MACROBLOCKD *xd,ModeCosts *mode_costs,int segment_id,
               uint *ref_costs_single,uint (*ref_costs_comp) [8])

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint8_t in_CL;
  long in_RDX;
  MACROBLOCKD *in_RSI;
  long in_RDI;
  undefined4 *in_R8;
  long in_R9;
  int ref1_1;
  int ref0_1;
  int uni_comp_ref_ctx_p2;
  int uni_comp_ref_ctx_p1;
  int uni_comp_ref_ctx_p;
  int ref1;
  int ref0;
  uint ref_bicomp_costs [8];
  int comp_ref_type_ctx;
  int ref_comp_ctx_p2;
  int ref_comp_ctx_p1;
  int ref_comp_ctx_p;
  int bwdref_comp_ctx_p1;
  int bwdref_comp_ctx_p;
  int ctx_p6;
  int ctx_p5;
  int ctx_p4;
  int ctx_p3;
  int ctx_p2;
  int ctx_p1;
  int i;
  uint base_cost;
  int intra_inter_ctx;
  int ref_frame;
  int seg_ref_active;
  int local_b4;
  int local_b0;
  int local_a0;
  int local_9c;
  int local_98 [4];
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  int local_44;
  int local_38;
  
  iVar1 = segfeature_active((segmentation *)(in_RDI + 19000),in_CL,'\x05');
  if (iVar1 == 0) {
    iVar2 = av1_get_intra_inter_context
                      ((MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78))
    ;
    *in_R8 = *(undefined4 *)(in_RDX + 0x3f18 + (long)iVar2 * 8);
    iVar1 = *(int *)(in_RDX + 0x3f1c + (long)iVar2 * 8);
    for (local_44 = 1; local_44 < 8; local_44 = local_44 + 1) {
      in_R8[local_44] = iVar1;
    }
    iVar3 = av1_get_pred_context_single_ref_p1(in_RSI);
    iVar4 = av1_get_pred_context_single_ref_p2((MACROBLOCKD *)0x2d09a3);
    iVar5 = av1_get_pred_context_single_ref_p3((MACROBLOCKD *)0x2d09b4);
    iVar6 = av1_get_pred_context_single_ref_p4((MACROBLOCKD *)0x2d09c5);
    iVar7 = av1_get_pred_context_single_ref_p5((MACROBLOCKD *)0x2d09d6);
    iVar8 = av1_get_pred_context_single_ref_p6((MACROBLOCKD *)0x2d09e7);
    in_R8[1] = *(int *)(in_RDX + 0x3d40 + (long)iVar3 * 0x30) + in_R8[1];
    in_R8[2] = *(int *)(in_RDX + 0x3d40 + (long)iVar3 * 0x30) + in_R8[2];
    in_R8[3] = *(int *)(in_RDX + 0x3d40 + (long)iVar3 * 0x30) + in_R8[3];
    in_R8[4] = *(int *)(in_RDX + 0x3d40 + (long)iVar3 * 0x30) + in_R8[4];
    in_R8[5] = *(int *)(in_RDX + (long)iVar3 * 0x30 + 0x3d44) + in_R8[5];
    in_R8[6] = *(int *)(in_RDX + (long)iVar3 * 0x30 + 0x3d44) + in_R8[6];
    in_R8[7] = *(int *)(in_RDX + (long)iVar3 * 0x30 + 0x3d44) + in_R8[7];
    in_R8[1] = *(int *)(in_RDX + (long)iVar5 * 0x30 + 0x3d50) + in_R8[1];
    in_R8[2] = *(int *)(in_RDX + (long)iVar5 * 0x30 + 0x3d50) + in_R8[2];
    in_R8[3] = *(int *)(in_RDX + (long)iVar5 * 0x30 + 0x3d54) + in_R8[3];
    in_R8[4] = *(int *)(in_RDX + (long)iVar5 * 0x30 + 0x3d54) + in_R8[4];
    in_R8[5] = *(int *)(in_RDX + (long)iVar4 * 0x30 + 0x3d48) + in_R8[5];
    in_R8[6] = *(int *)(in_RDX + (long)iVar4 * 0x30 + 0x3d48) + in_R8[6];
    in_R8[7] = *(int *)(in_RDX + (long)iVar4 * 0x30 + 0x3d4c) + in_R8[7];
    in_R8[1] = *(int *)(in_RDX + (long)iVar6 * 0x30 + 0x3d58) + in_R8[1];
    in_R8[2] = *(int *)(in_RDX + (long)iVar6 * 0x30 + 0x3d5c) + in_R8[2];
    in_R8[3] = *(int *)(in_RDX + (long)iVar7 * 0x30 + 0x3d60) + in_R8[3];
    in_R8[4] = *(int *)(in_RDX + (long)iVar7 * 0x30 + 0x3d64) + in_R8[4];
    in_R8[5] = *(int *)(in_RDX + (long)iVar8 * 0x30 + 0x3d68) + in_R8[5];
    in_R8[6] = *(int *)(in_RDX + (long)iVar8 * 0x30 + 0x3d6c) + in_R8[6];
    if (*(char *)(in_RDI + 1) == '\0') {
      for (local_b0 = 1; local_b0 < 5; local_b0 = local_b0 + 1) {
        for (local_b4 = 5; local_b4 < 8; local_b4 = local_b4 + 1) {
          *(undefined4 *)(in_R9 + (long)local_b0 * 0x20 + (long)local_b4 * 4) = 0x200;
        }
      }
      *(undefined4 *)(in_R9 + 0x28) = 0x200;
      *(undefined4 *)(in_R9 + 0x2c) = 0x200;
      *(undefined4 *)(in_R9 + 0x30) = 0x200;
      *(undefined4 *)(in_R9 + 0xbc) = 0x200;
    }
    else {
      av1_get_pred_context_comp_bwdref_p((MACROBLOCKD *)0x2d0d65);
      av1_get_pred_context_comp_bwdref_p1((MACROBLOCKD *)0x2d0d76);
      iVar3 = av1_get_pred_context_comp_ref_p((MACROBLOCKD *)0x2d0d87);
      iVar4 = av1_get_pred_context_comp_ref_p1((MACROBLOCKD *)0x2d0d98);
      iVar5 = av1_get_pred_context_comp_ref_p2((MACROBLOCKD *)0x2d0da9);
      iVar2 = av1_get_comp_reference_type_context((MACROBLOCKD *)CONCAT44(iVar2,iVar1));
      memset(local_98,0,0x20);
      iVar6 = iVar1 + *(int *)(in_RDX + (long)iVar2 * 0xc + 0x3dfc);
      local_98[1] = *(int *)(in_RDX + (long)iVar4 * 0x18 + 0x3ea8) +
                    *(int *)(in_RDX + 0x3ea0 + (long)iVar3 * 0x18) + iVar6;
      local_98[2] = *(int *)(in_RDX + (long)iVar4 * 0x18 + 0x3eac) +
                    *(int *)(in_RDX + 0x3ea0 + (long)iVar3 * 0x18) + iVar6;
      local_98[3] = *(int *)(in_RDX + (long)iVar5 * 0x18 + 0x3eb0) +
                    *(int *)(in_RDX + (long)iVar3 * 0x18 + 0x3ea4) + iVar6;
      for (local_9c = 1; local_9c < 5; local_9c = local_9c + 1) {
        for (local_a0 = 5; local_a0 < 8; local_a0 = local_a0 + 1) {
          *(int *)(in_R9 + (long)local_9c * 0x20 + (long)local_a0 * 4) =
               local_98[local_9c] + local_98[local_a0];
        }
      }
      iVar3 = av1_get_pred_context_uni_comp_ref_p(in_RSI);
      iVar4 = av1_get_pred_context_uni_comp_ref_p1(in_RSI);
      iVar5 = av1_get_pred_context_uni_comp_ref_p2(in_RSI);
      *(int *)(in_R9 + 0x28) =
           iVar1 + *(int *)(in_RDX + 0x3df8 + (long)iVar2 * 0xc) +
           *(int *)(in_RDX + 0x3e34 + (long)iVar3 * 0x24) +
           *(int *)(in_RDX + (long)iVar4 * 0x24 + 0x3e40);
      *(int *)(in_R9 + 0x2c) =
           iVar1 + *(int *)(in_RDX + 0x3df8 + (long)iVar2 * 0xc) +
           *(int *)(in_RDX + 0x3e34 + (long)iVar3 * 0x24) +
           *(int *)(in_RDX + (long)iVar4 * 0x24 + 0x3e44) +
           *(int *)(in_RDX + (long)iVar5 * 0x24 + 0x3e4c);
      *(int *)(in_R9 + 0x30) =
           iVar1 + *(int *)(in_RDX + 0x3df8 + (long)iVar2 * 0xc) +
           *(int *)(in_RDX + 0x3e34 + (long)iVar3 * 0x24) +
           *(int *)(in_RDX + (long)iVar4 * 0x24 + 0x3e44) +
           *(int *)(in_RDX + (long)iVar5 * 0x24 + 0x3e50);
      *(int *)(in_R9 + 0xbc) =
           iVar1 + *(int *)(in_RDX + 0x3df8 + (long)iVar2 * 0xc) +
           *(int *)(in_RDX + (long)iVar3 * 0x24 + 0x3e38);
    }
  }
  else {
    memset(in_R8,0,0x20);
    for (local_38 = 0; local_38 < 8; local_38 = local_38 + 1) {
      memset((void *)(in_R9 + (long)local_38 * 0x20),0,0x20);
    }
  }
  return;
}

Assistant:

static inline void estimate_ref_frame_costs(
    const AV1_COMMON *cm, const MACROBLOCKD *xd, const ModeCosts *mode_costs,
    int segment_id, unsigned int *ref_costs_single,
    unsigned int (*ref_costs_comp)[REF_FRAMES]) {
  int seg_ref_active =
      segfeature_active(&cm->seg, segment_id, SEG_LVL_REF_FRAME);
  if (seg_ref_active) {
    memset(ref_costs_single, 0, REF_FRAMES * sizeof(*ref_costs_single));
    int ref_frame;
    for (ref_frame = 0; ref_frame < REF_FRAMES; ++ref_frame)
      memset(ref_costs_comp[ref_frame], 0,
             REF_FRAMES * sizeof((*ref_costs_comp)[0]));
  } else {
    int intra_inter_ctx = av1_get_intra_inter_context(xd);
    ref_costs_single[INTRA_FRAME] =
        mode_costs->intra_inter_cost[intra_inter_ctx][0];
    unsigned int base_cost = mode_costs->intra_inter_cost[intra_inter_ctx][1];

    for (int i = LAST_FRAME; i <= ALTREF_FRAME; ++i)
      ref_costs_single[i] = base_cost;

    const int ctx_p1 = av1_get_pred_context_single_ref_p1(xd);
    const int ctx_p2 = av1_get_pred_context_single_ref_p2(xd);
    const int ctx_p3 = av1_get_pred_context_single_ref_p3(xd);
    const int ctx_p4 = av1_get_pred_context_single_ref_p4(xd);
    const int ctx_p5 = av1_get_pred_context_single_ref_p5(xd);
    const int ctx_p6 = av1_get_pred_context_single_ref_p6(xd);

    // Determine cost of a single ref frame, where frame types are represented
    // by a tree:
    // Level 0: add cost whether this ref is a forward or backward ref
    ref_costs_single[LAST_FRAME] += mode_costs->single_ref_cost[ctx_p1][0][0];
    ref_costs_single[LAST2_FRAME] += mode_costs->single_ref_cost[ctx_p1][0][0];
    ref_costs_single[LAST3_FRAME] += mode_costs->single_ref_cost[ctx_p1][0][0];
    ref_costs_single[GOLDEN_FRAME] += mode_costs->single_ref_cost[ctx_p1][0][0];
    ref_costs_single[BWDREF_FRAME] += mode_costs->single_ref_cost[ctx_p1][0][1];
    ref_costs_single[ALTREF2_FRAME] +=
        mode_costs->single_ref_cost[ctx_p1][0][1];
    ref_costs_single[ALTREF_FRAME] += mode_costs->single_ref_cost[ctx_p1][0][1];

    // Level 1: if this ref is forward ref,
    // add cost whether it is last/last2 or last3/golden
    ref_costs_single[LAST_FRAME] += mode_costs->single_ref_cost[ctx_p3][2][0];
    ref_costs_single[LAST2_FRAME] += mode_costs->single_ref_cost[ctx_p3][2][0];
    ref_costs_single[LAST3_FRAME] += mode_costs->single_ref_cost[ctx_p3][2][1];
    ref_costs_single[GOLDEN_FRAME] += mode_costs->single_ref_cost[ctx_p3][2][1];

    // Level 1: if this ref is backward ref
    // then add cost whether this ref is altref or backward ref
    ref_costs_single[BWDREF_FRAME] += mode_costs->single_ref_cost[ctx_p2][1][0];
    ref_costs_single[ALTREF2_FRAME] +=
        mode_costs->single_ref_cost[ctx_p2][1][0];
    ref_costs_single[ALTREF_FRAME] += mode_costs->single_ref_cost[ctx_p2][1][1];

    // Level 2: further add cost whether this ref is last or last2
    ref_costs_single[LAST_FRAME] += mode_costs->single_ref_cost[ctx_p4][3][0];
    ref_costs_single[LAST2_FRAME] += mode_costs->single_ref_cost[ctx_p4][3][1];

    // Level 2: last3 or golden
    ref_costs_single[LAST3_FRAME] += mode_costs->single_ref_cost[ctx_p5][4][0];
    ref_costs_single[GOLDEN_FRAME] += mode_costs->single_ref_cost[ctx_p5][4][1];

    // Level 2: bwdref or altref2
    ref_costs_single[BWDREF_FRAME] += mode_costs->single_ref_cost[ctx_p6][5][0];
    ref_costs_single[ALTREF2_FRAME] +=
        mode_costs->single_ref_cost[ctx_p6][5][1];

    if (cm->current_frame.reference_mode != SINGLE_REFERENCE) {
      // Similar to single ref, determine cost of compound ref frames.
      // cost_compound_refs = cost_first_ref + cost_second_ref
      const int bwdref_comp_ctx_p = av1_get_pred_context_comp_bwdref_p(xd);
      const int bwdref_comp_ctx_p1 = av1_get_pred_context_comp_bwdref_p1(xd);
      const int ref_comp_ctx_p = av1_get_pred_context_comp_ref_p(xd);
      const int ref_comp_ctx_p1 = av1_get_pred_context_comp_ref_p1(xd);
      const int ref_comp_ctx_p2 = av1_get_pred_context_comp_ref_p2(xd);

      const int comp_ref_type_ctx = av1_get_comp_reference_type_context(xd);
      unsigned int ref_bicomp_costs[REF_FRAMES] = { 0 };

      ref_bicomp_costs[LAST_FRAME] = ref_bicomp_costs[LAST2_FRAME] =
          ref_bicomp_costs[LAST3_FRAME] = ref_bicomp_costs[GOLDEN_FRAME] =
              base_cost + mode_costs->comp_ref_type_cost[comp_ref_type_ctx][1];
      ref_bicomp_costs[BWDREF_FRAME] = ref_bicomp_costs[ALTREF2_FRAME] = 0;
      ref_bicomp_costs[ALTREF_FRAME] = 0;

      // cost of first ref frame
      ref_bicomp_costs[LAST_FRAME] +=
          mode_costs->comp_ref_cost[ref_comp_ctx_p][0][0];
      ref_bicomp_costs[LAST2_FRAME] +=
          mode_costs->comp_ref_cost[ref_comp_ctx_p][0][0];
      ref_bicomp_costs[LAST3_FRAME] +=
          mode_costs->comp_ref_cost[ref_comp_ctx_p][0][1];
      ref_bicomp_costs[GOLDEN_FRAME] +=
          mode_costs->comp_ref_cost[ref_comp_ctx_p][0][1];

      ref_bicomp_costs[LAST_FRAME] +=
          mode_costs->comp_ref_cost[ref_comp_ctx_p1][1][0];
      ref_bicomp_costs[LAST2_FRAME] +=
          mode_costs->comp_ref_cost[ref_comp_ctx_p1][1][1];

      ref_bicomp_costs[LAST3_FRAME] +=
          mode_costs->comp_ref_cost[ref_comp_ctx_p2][2][0];
      ref_bicomp_costs[GOLDEN_FRAME] +=
          mode_costs->comp_ref_cost[ref_comp_ctx_p2][2][1];

      // cost of second ref frame
      ref_bicomp_costs[BWDREF_FRAME] +=
          mode_costs->comp_bwdref_cost[bwdref_comp_ctx_p][0][0];
      ref_bicomp_costs[ALTREF2_FRAME] +=
          mode_costs->comp_bwdref_cost[bwdref_comp_ctx_p][0][0];
      ref_bicomp_costs[ALTREF_FRAME] +=
          mode_costs->comp_bwdref_cost[bwdref_comp_ctx_p][0][1];

      ref_bicomp_costs[BWDREF_FRAME] +=
          mode_costs->comp_bwdref_cost[bwdref_comp_ctx_p1][1][0];
      ref_bicomp_costs[ALTREF2_FRAME] +=
          mode_costs->comp_bwdref_cost[bwdref_comp_ctx_p1][1][1];

      // cost: if one ref frame is forward ref, the other ref is backward ref
      int ref0, ref1;
      for (ref0 = LAST_FRAME; ref0 <= GOLDEN_FRAME; ++ref0) {
        for (ref1 = BWDREF_FRAME; ref1 <= ALTREF_FRAME; ++ref1) {
          ref_costs_comp[ref0][ref1] =
              ref_bicomp_costs[ref0] + ref_bicomp_costs[ref1];
        }
      }

      // cost: if both ref frames are the same side.
      const int uni_comp_ref_ctx_p = av1_get_pred_context_uni_comp_ref_p(xd);
      const int uni_comp_ref_ctx_p1 = av1_get_pred_context_uni_comp_ref_p1(xd);
      const int uni_comp_ref_ctx_p2 = av1_get_pred_context_uni_comp_ref_p2(xd);
      ref_costs_comp[LAST_FRAME][LAST2_FRAME] =
          base_cost + mode_costs->comp_ref_type_cost[comp_ref_type_ctx][0] +
          mode_costs->uni_comp_ref_cost[uni_comp_ref_ctx_p][0][0] +
          mode_costs->uni_comp_ref_cost[uni_comp_ref_ctx_p1][1][0];
      ref_costs_comp[LAST_FRAME][LAST3_FRAME] =
          base_cost + mode_costs->comp_ref_type_cost[comp_ref_type_ctx][0] +
          mode_costs->uni_comp_ref_cost[uni_comp_ref_ctx_p][0][0] +
          mode_costs->uni_comp_ref_cost[uni_comp_ref_ctx_p1][1][1] +
          mode_costs->uni_comp_ref_cost[uni_comp_ref_ctx_p2][2][0];
      ref_costs_comp[LAST_FRAME][GOLDEN_FRAME] =
          base_cost + mode_costs->comp_ref_type_cost[comp_ref_type_ctx][0] +
          mode_costs->uni_comp_ref_cost[uni_comp_ref_ctx_p][0][0] +
          mode_costs->uni_comp_ref_cost[uni_comp_ref_ctx_p1][1][1] +
          mode_costs->uni_comp_ref_cost[uni_comp_ref_ctx_p2][2][1];
      ref_costs_comp[BWDREF_FRAME][ALTREF_FRAME] =
          base_cost + mode_costs->comp_ref_type_cost[comp_ref_type_ctx][0] +
          mode_costs->uni_comp_ref_cost[uni_comp_ref_ctx_p][0][1];
    } else {
      int ref0, ref1;
      for (ref0 = LAST_FRAME; ref0 <= GOLDEN_FRAME; ++ref0) {
        for (ref1 = BWDREF_FRAME; ref1 <= ALTREF_FRAME; ++ref1)
          ref_costs_comp[ref0][ref1] = 512;
      }
      ref_costs_comp[LAST_FRAME][LAST2_FRAME] = 512;
      ref_costs_comp[LAST_FRAME][LAST3_FRAME] = 512;
      ref_costs_comp[LAST_FRAME][GOLDEN_FRAME] = 512;
      ref_costs_comp[BWDREF_FRAME][ALTREF_FRAME] = 512;
    }
  }
}